

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::packRows(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  U *pUVar1;
  fpclass_type *pfVar2;
  fpclass_type *pfVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  pointer pnVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  long lVar11;
  long lVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  fpclass_type *pfVar14;
  fpclass_type *pfVar15;
  Dring *pDVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  
  pUVar1 = &this->u;
  pDVar16 = (this->u).row.list.next;
  if ((U *)pDVar16 == pUVar1) {
    uVar17 = 0;
  }
  else {
    piVar6 = (this->u).row.idx;
    pnVar7 = (this->u).row.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar8 = (this->u).row.len;
    piVar9 = (this->u).row.max;
    piVar10 = (this->u).row.start;
    uVar19 = 0;
    do {
      iVar4 = pDVar16->idx;
      if (piVar10[iVar4] != (int)uVar19) {
        do {
          iVar4 = pDVar16->idx;
          iVar5 = piVar10[iVar4];
          iVar18 = (int)uVar19;
          piVar10[iVar4] = iVar18;
          piVar9[iVar4] = piVar8[iVar4];
          iVar4 = piVar8[iVar4];
          if (0 < iVar4) {
            lVar12 = (long)iVar5;
            pfVar15 = &(pnVar7->m_backend).fpclass;
            uVar19 = (long)iVar18;
            do {
              piVar6[uVar19] = piVar6[lVar12];
              pfVar2 = pfVar15 + (long)iVar5 * 0x20;
              pfVar3 = pfVar15 + (long)iVar18 * 0x20 + -0x1e;
              pcVar13 = (cpp_dec_float<200U,_int,_void> *)(pfVar2 + -0x1e);
              pfVar14 = pfVar3;
              for (lVar11 = 0x1c; lVar11 != 0; lVar11 = lVar11 + -1) {
                *pfVar14 = (pcVar13->data)._M_elems[0];
                pcVar13 = (cpp_dec_float<200U,_int,_void> *)((pcVar13->data)._M_elems + 1);
                pfVar14 = pfVar14 + 1;
              }
              pfVar3[0x1c] = pfVar2[-2];
              *(bool *)(pfVar3 + 0x1d) = *(bool *)(pfVar2 + -1);
              *(undefined8 *)(pfVar3 + 0x1e) = *(undefined8 *)pfVar2;
              lVar12 = lVar12 + 1;
              uVar19 = uVar19 + 1;
              pfVar15 = pfVar15 + 0x20;
            } while (lVar12 < iVar4 + iVar5);
          }
          uVar17 = (uint)uVar19;
          pDVar16 = pDVar16->next;
        } while ((U *)pDVar16 != pUVar1);
        break;
      }
      uVar17 = (int)uVar19 + piVar8[iVar4];
      uVar19 = (ulong)uVar17;
      piVar9[iVar4] = piVar8[iVar4];
      pDVar16 = pDVar16->next;
    } while ((U *)pDVar16 != pUVar1);
  }
  (this->u).row.max[this->thedim] = 0;
  (this->u).row.used = uVar17;
  return;
}

Assistant:

void CLUFactor<R>::packRows()
{
   int n, i, j, l_row;
   Dring* ring, *list;

   int* l_ridx = u.row.idx;
   R* l_rval = u.row.val.data();
   int* l_rlen = u.row.len;
   int* l_rmax = u.row.max;
   int* l_rbeg = u.row.start;

   n = 0;
   list = &(u.row.list);

   for(ring = list->next; ring != list; ring = ring->next)
   {
      l_row = ring->idx;

      if(l_rbeg[l_row] != n)
      {
         do
         {
            l_row = ring->idx;
            i = l_rbeg[l_row];
            assert(l_rlen[l_row] <= l_rmax[l_row]);
            l_rbeg[l_row] = n;
            l_rmax[l_row] = l_rlen[l_row];
            j = i + l_rlen[l_row];

            for(; i < j; ++i, ++n)
            {
               assert(n <= i);
               l_ridx[n] = l_ridx[i];
               l_rval[n] = l_rval[i];
            }

            ring = ring->next;
         }
         while(ring != list);

         goto terminatePackRows;
      }

      n += l_rlen[l_row];

      l_rmax[l_row] = l_rlen[l_row];
   }

terminatePackRows:

   u.row.max[thedim] = 0;
   u.row.used = n;
}